

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O2

LogStream * __thiscall LogStream::operator<<(LogStream *this,int v)

{
  formatInteger<int>(this,v);
  return this;
}

Assistant:

LogStream& LogStream::operator<<(int v) {
    formatInteger(v);
    return *this;
}